

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O1

void __thiscall
Eigen::RefBase<Eigen::Ref<Eigen::Matrix<double,-1,2,1,-1,2>,0,Eigen::OuterStride<-1>>>::
construct<Eigen::Matrix<double,_1,2,1,_1,2>>
          (RefBase<Eigen::Ref<Eigen::Matrix<double,_1,2,1,_1,2>,0,Eigen::OuterStride<_1>>> *this,
          Matrix<double,__1,_2,_1,__1,_2> *expr)

{
  double *pdVar1;
  long lVar2;
  
  pdVar1 = (expr->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>).m_storage.m_data;
  lVar2 = (expr->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>).m_storage.m_rows;
  *(double **)this = pdVar1;
  *(long *)(this + 8) = lVar2;
  if (-1 < lVar2 || pdVar1 == (double *)0x0) {
    *(undefined8 *)(this + 0x18) = 2;
    return;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/MapBase.h"
                ,0xb0,
                "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 2>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 2>>, Level = 0]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC T *data() { return m_data; }